

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

Var __thiscall Js::JavascriptRegExp::GetOptions(JavascriptRegExp *this)

{
  bool bVar1;
  charcount_t cchUseLength;
  JavascriptLibrary *this_00;
  ScriptContext *this_01;
  TempArenaAllocatorObject *this_02;
  RegexPattern *pRVar2;
  char16 *content;
  JavascriptString *pJVar3;
  undefined1 local_68 [8];
  StringBuilder<Memory::ArenaAllocator> bs;
  ArenaAllocator *tempAlloc;
  TempArenaAllocatorObject *temptempAlloc;
  ScriptContext *scriptContext;
  Var options;
  JavascriptRegExp *this_local;
  
  this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
  this_01 = JavascriptLibrary::GetScriptContext(this_00);
  this_02 = ScriptContext::GetTemporaryAllocator(this_01,L"JavascriptRegExp");
  bs._48_8_ = TempArenaAllocatorWrapper<false>::GetAllocator(this_02);
  StringBuilder<Memory::ArenaAllocator>::StringBuilder
            ((StringBuilder<Memory::ArenaAllocator> *)local_68,(ArenaAllocator *)bs._48_8_,4);
  pRVar2 = GetPattern(this);
  bVar1 = UnifiedRegex::RegexPattern::IsGlobal(pRVar2);
  if (bVar1) {
    StringBuilder<Memory::ArenaAllocator>::Append
              ((StringBuilder<Memory::ArenaAllocator> *)local_68,L'g');
  }
  pRVar2 = GetPattern(this);
  bVar1 = UnifiedRegex::RegexPattern::IsIgnoreCase(pRVar2);
  if (bVar1) {
    StringBuilder<Memory::ArenaAllocator>::Append
              ((StringBuilder<Memory::ArenaAllocator> *)local_68,L'i');
  }
  pRVar2 = GetPattern(this);
  bVar1 = UnifiedRegex::RegexPattern::IsMultiline(pRVar2);
  if (bVar1) {
    StringBuilder<Memory::ArenaAllocator>::Append
              ((StringBuilder<Memory::ArenaAllocator> *)local_68,L'm');
  }
  pRVar2 = GetPattern(this);
  bVar1 = UnifiedRegex::RegexPattern::IsDotAll(pRVar2);
  if (bVar1) {
    StringBuilder<Memory::ArenaAllocator>::Append
              ((StringBuilder<Memory::ArenaAllocator> *)local_68,L's');
  }
  pRVar2 = GetPattern(this);
  bVar1 = UnifiedRegex::RegexPattern::IsUnicode(pRVar2);
  if (bVar1) {
    StringBuilder<Memory::ArenaAllocator>::Append
              ((StringBuilder<Memory::ArenaAllocator> *)local_68,L'u');
  }
  pRVar2 = GetPattern(this);
  bVar1 = UnifiedRegex::RegexPattern::IsSticky(pRVar2);
  if (bVar1) {
    StringBuilder<Memory::ArenaAllocator>::Append
              ((StringBuilder<Memory::ArenaAllocator> *)local_68,L'y');
  }
  content = StringBuilder<Memory::ArenaAllocator>::Detach
                      ((StringBuilder<Memory::ArenaAllocator> *)local_68);
  cchUseLength = StringBuilder<Memory::ArenaAllocator>::Count
                           ((StringBuilder<Memory::ArenaAllocator> *)local_68);
  pJVar3 = JavascriptString::NewCopyBuffer(content,cchUseLength,this_01);
  ScriptContext::ReleaseTemporaryAllocator(this_01,this_02);
  return pJVar3;
}

Assistant:

Var JavascriptRegExp::GetOptions()
    {
        Var options;

        ScriptContext* scriptContext = this->GetLibrary()->GetScriptContext();
        BEGIN_TEMP_ALLOCATOR(tempAlloc, scriptContext, _u("JavascriptRegExp"))
        {
            StringBuilder<ArenaAllocator> bs(tempAlloc, 4);

            // If you change the order of the flags, don't forget to change it in EntryGetterFlags() and ToString() too.
            if(GetPattern()->IsGlobal())
            {
                bs.Append(_u('g'));
            }
            if(GetPattern()->IsIgnoreCase())
            {
                bs.Append(_u('i'));
            }
            if(GetPattern()->IsMultiline())
            {
                bs.Append(_u('m'));
            }
            if(GetPattern()->IsDotAll())
            {
                bs.Append(_u('s'));
            }
            if (GetPattern()->IsUnicode())
            {
                bs.Append(_u('u'));
            }
            if (GetPattern()->IsSticky())
            {
                bs.Append(_u('y'));
            }
            options = Js::JavascriptString::NewCopyBuffer(bs.Detach(), bs.Count(), scriptContext);
        }
        END_TEMP_ALLOCATOR(tempAlloc, scriptContext);

        return options;
    }